

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O0

void __thiscall
Lib::Array<unsigned_int>::Array(Array<unsigned_int> *this,initializer_list<unsigned_int> contents)

{
  const_iterator puVar1;
  const_iterator puVar2;
  initializer_list<unsigned_int> *in_RDI;
  uint i;
  const_iterator iter;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  uint uVar3;
  Array<unsigned_int> *in_stack_ffffffffffffffe0;
  const_iterator puVar4;
  initializer_list<unsigned_int> local_10;
  
  std::initializer_list<unsigned_int>::size(&local_10);
  Array(in_stack_ffffffffffffffe0,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  puVar1 = std::initializer_list<unsigned_int>::begin(&local_10);
  uVar3 = 0;
  while( true ) {
    puVar4 = puVar1;
    puVar2 = std::initializer_list<unsigned_int>::end(in_RDI);
    if (puVar1 == puVar2) break;
    in_RDI[1]._M_array[uVar3] = *puVar4;
    puVar1 = puVar4 + 1;
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

inline
  Array (std::initializer_list<C> contents)
    : Array(contents.size()) 
  {
    auto iter = contents.begin();
    unsigned i = 0;
    while(iter != contents.end()) {
      ASS(i < _capacity)
      _array[i] = std::move(*iter);
      iter++;
      i++;
    }
  }